

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_close_test(player *p,loc grid)

{
  _Bool _Var1;
  square *psVar2;
  char *fmt;
  
  _Var1 = square_isknown(cave,grid);
  if (_Var1) {
    _Var1 = square_isopendoor(cave,grid);
    if ((!_Var1) && (_Var1 = square_isbrokendoor(cave,grid), !_Var1)) {
      msg("You see nothing there to close.");
      _Var1 = square_isopendoor((chunk_conflict *)p->cave,grid);
      if ((_Var1) || (_Var1 = square_isbrokendoor((chunk_conflict *)p->cave,grid), _Var1)) {
        square_forget(cave,grid);
        square_light_spot((chunk *)cave,grid);
      }
      return false;
    }
    psVar2 = square(cave,grid);
    if (-1 < psVar2->mon) {
      return true;
    }
    fmt = "You\'re standing in that doorway.";
  }
  else {
    fmt = "You see nothing there.";
  }
  msg(fmt);
  return false;
}

Assistant:

static bool do_cmd_close_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		/* Message */
		msg("You see nothing there.");

		/* Nope */
		return (false);
	}

 	/* Require open/broken door */
	if (!square_isopendoor(cave, grid) && !square_isbrokendoor(cave, grid)) {
		/* Message */
		msg("You see nothing there to close.");
		if (square_isopendoor(p->cave, grid)
				|| square_isbrokendoor(p->cave, grid)) {
			square_forget(cave, grid);
			square_light_spot(cave, grid);
		}

		/* Nope */
		return (false);
	}

	/* Don't allow if player is in the way. */
	if (square(cave, grid)->mon < 0) {
		/* Message */
		msg("You're standing in that doorway.");

		/* Nope */
		return (false);
	}

	/* Okay */
	return (true);
}